

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O0

void __thiscall tst_qpromise_convert::fulfillTAsQVariant(tst_qpromise_convert *this)

{
  undefined1 *this_00;
  bool bVar1;
  byte bVar2;
  Foo FVar3;
  Foo local_13c;
  enable_if_t<std::is_copy_constructible_v<(anonymous_namespace)::Foo>,_QVariant> local_138;
  QVariant local_118;
  undefined1 local_f8 [8];
  QVariant value;
  QPromise<(anonymous_namespace)::Foo> local_d0;
  undefined1 local_c0 [8];
  QPromise<QVariant> p_1;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  int local_34;
  QPromise<int> local_30;
  undefined1 local_20 [8];
  QPromise<QVariant> p;
  tst_qpromise_convert *this_local;
  
  local_34 = 0x2a;
  p.super_QPromiseBase<QVariant>.m_d.d = (PromiseData<QVariant> *)this;
  QtPromise::resolve<int>((QtPromise *)&local_30,&local_34);
  QtPromise::QPromise<int>::convert<QVariant>((QPromise<int> *)local_20);
  QtPromise::QPromise<int>::~QPromise(&local_30);
  QVariant::QVariant(&local_88);
  waitForValue<QVariant>(&local_68,(QPromise<QVariant> *)local_20,&local_88);
  QVariant::QVariant(&local_a8,0x2a);
  bVar1 = QTest::qCompare<QVariant,QVariant>
                    (&local_68,&local_a8,"waitForValue(p, QVariant{})","QVariant{42}",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xaf);
  QVariant::~QVariant(&local_a8);
  QVariant::~QVariant(&local_68);
  QVariant::~QVariant(&local_88);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = QtPromise::QPromiseBase<QVariant>::isFulfilled((QPromiseBase<QVariant> *)local_20);
    bVar2 = QTest::qVerify(bVar1,"p.isFulfilled()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xb0);
    if ((bVar2 & 1) == 0) {
      p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 1;
    }
    else {
      p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 0;
    }
  }
  else {
    p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 1;
  }
  QtPromise::QPromise<QVariant>::~QPromise((QPromise<QVariant> *)local_20);
  if (p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ == 0) {
    this_00 = &value.d.field_0x1c;
    anon_unknown.dwarf_36992::Foo::Foo((Foo *)this_00,0x2a);
    QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_d0,(Foo *)this_00);
    QtPromise::QPromise<(anonymous_namespace)::Foo>::convert<QVariant>
              ((QPromise<(anonymous_namespace)::Foo> *)local_c0);
    QtPromise::QPromise<(anonymous_namespace)::Foo>::~QPromise(&local_d0);
    QVariant::QVariant(&local_118);
    waitForValue<QVariant>((QVariant *)local_f8,(QPromise<QVariant> *)local_c0,&local_118);
    QVariant::~QVariant(&local_118);
    anon_unknown.dwarf_36992::Foo::Foo(&local_13c,0x2a);
    QVariant::fromValue<(anonymous_namespace)::Foo>(&local_138,&local_13c);
    bVar1 = QTest::qCompare<QVariant,QVariant>
                      ((QVariant *)local_f8,&local_138,"value","QVariant::fromValue(Foo{42})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0xba);
    QVariant::~QVariant(&local_138);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      FVar3 = QVariant::value<(anonymous_namespace)::Foo>((QVariant *)local_f8);
      bVar2 = QTest::qCompare(FVar3.m_foo,0x2a,"value.value<Foo>().m_foo","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                              ,0xbb);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        bVar1 = QtPromise::QPromiseBase<QVariant>::isFulfilled((QPromiseBase<QVariant> *)local_c0);
        bVar2 = QTest::qVerify(bVar1,"p.isFulfilled()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                               ,0xbc);
        if ((bVar2 & 1) == 0) {
          p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 1;
        }
        else {
          p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 0;
        }
      }
      else {
        p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 1;
      }
    }
    else {
      p_1.super_QPromiseBase<QVariant>.m_d.d._4_4_ = 1;
    }
    QVariant::~QVariant((QVariant *)local_f8);
    QtPromise::QPromise<QVariant>::~QPromise((QPromise<QVariant> *)local_c0);
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsQVariant()
{
    // Primitive type to QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QCOMPARE(waitForValue(p, QVariant{}), QVariant{42});
        QVERIFY(p.isFulfilled());
    }

    // Non-Qt user-defined type to QVariant.
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QVariant value = waitForValue(p, QVariant{});
        QCOMPARE(value, QVariant::fromValue(Foo{42}));
        QCOMPARE(value.value<Foo>().m_foo, 42);
        QVERIFY(p.isFulfilled());
    }
}